

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

int FIX::socket_connect(socket_handle socket,char *address,int port)

{
  undefined1 local_38 [4];
  int result;
  sockaddr_in addr;
  char *hostname;
  int port_local;
  char *address_local;
  socket_handle socket_local;
  
  addr.sin_zero = (uchar  [8])socket_hostname(address);
  if (addr.sin_zero == (uchar  [8])0x0) {
    address_local._4_4_ = -1;
  }
  else {
    local_38._0_2_ = 2;
    local_38._2_2_ = htons((uint16_t)port);
    result = inet_addr((char *)addr.sin_zero);
    address_local._4_4_ = connect(socket,(sockaddr *)local_38,0x10);
  }
  return address_local._4_4_;
}

Assistant:

int socket_connect(socket_handle socket, const char *address, int port) {
  const char *hostname = socket_hostname(address);
  if (hostname == 0) {
#ifdef _MSC_VER
    // In a case of Windows + MSVC, select() does not fire a write event for
    // a bare socket (no connection ever attempted). Therefore the later
    // logic, which is based on unconditional continuation with select(),
    // leads to a deadlock (the select never gets back) for the connecting session.
    // So keep going ahead with a bad address to issue a faulty connect.
    hostname = address;
#else
    return -1;
#endif
  }

  sockaddr_in addr;
  addr.sin_family = PF_INET;
  addr.sin_port = htons(port);
  addr.sin_addr.s_addr = inet_addr(hostname);

  int result = connect(socket, reinterpret_cast<sockaddr *>(&addr), sizeof(addr));

  return result;
}